

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::UserDefinedNetDeclarationSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,UserDefinedNetDeclarationSyntax *this,
          size_t index)

{
  Token token;
  Token token_00;
  SyntaxNode *node;
  SyntaxNode *local_70;
  SyntaxNode *local_60;
  size_t index_local;
  UserDefinedNetDeclarationSyntax *this_local;
  
  switch(index) {
  case 0:
    local_60 = (SyntaxNode *)0x0;
    if (this != (UserDefinedNetDeclarationSyntax *)0xfffffffffffffff0) {
      local_60 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_60);
    break;
  case 1:
    token.kind = (this->netType).kind;
    token._2_1_ = (this->netType).field_0x2;
    token.numFlags.raw = (this->netType).numFlags.raw;
    token.rawLen = (this->netType).rawLen;
    token.info = (this->netType).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 2:
    node = &not_null<slang::syntax::TimingControlSyntax_*>::get(&this->delay)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 3:
    local_70 = (SyntaxNode *)0x0;
    if (this != (UserDefinedNetDeclarationSyntax *)0xffffffffffffffa8) {
      local_70 = &(this->declarators).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_70);
    break;
  case 4:
    token_00.kind = (this->semi).kind;
    token_00._2_1_ = (this->semi).field_0x2;
    token_00.numFlags.raw = (this->semi).numFlags.raw;
    token_00.rawLen = (this->semi).rawLen;
    token_00.info = (this->semi).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax UserDefinedNetDeclarationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return netType;
        case 2: return delay.get();
        case 3: return &declarators;
        case 4: return semi;
        default: return nullptr;
    }
}